

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zeFabricEdgeGetExp
          (ze_fabric_vertex_handle_t hVertexA,ze_fabric_vertex_handle_t hVertexB,uint32_t *pCount,
          ze_fabric_edge_handle_t *phEdges)

{
  ze_result_t zVar1;
  ulong uVar2;
  
  if (DAT_0010d740 != (code *)0x0) {
    zVar1 = (*DAT_0010d740)();
    return zVar1;
  }
  if (phEdges != (ze_fabric_edge_handle_t *)0x0) {
    for (uVar2 = 0; uVar2 < *pCount; uVar2 = uVar2 + 1) {
      context_t::get()::count = context_t::get()::count + 1;
      phEdges[uVar2] = context_t::get()::count;
    }
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFabricEdgeGetExp(
        ze_fabric_vertex_handle_t hVertexA,             ///< [in] handle of first fabric vertex instance
        ze_fabric_vertex_handle_t hVertexB,             ///< [in] handle of second fabric vertex instance
        uint32_t* pCount,                               ///< [in,out] pointer to the number of fabric edges.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of fabric edges available.
                                                        ///< if count is greater than the number of fabric edges available, then
                                                        ///< the driver shall update the value with the correct number of fabric
                                                        ///< edges available.
        ze_fabric_edge_handle_t* phEdges                ///< [in,out][optional][range(0, *pCount)] array of handle of fabric edges.
                                                        ///< if count is less than the number of fabric edges available, then
                                                        ///< driver shall only retrieve that number of fabric edges.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetExp = context.zeDdiTable.FabricEdgeExp.pfnGetExp;
        if( nullptr != pfnGetExp )
        {
            result = pfnGetExp( hVertexA, hVertexB, pCount, phEdges );
        }
        else
        {
            // generic implementation
            for( size_t i = 0; ( nullptr != phEdges ) && ( i < *pCount ); ++i )
                phEdges[ i ] = reinterpret_cast<ze_fabric_edge_handle_t>( context.get() );

        }

        return result;
    }